

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O3

void Ssw_ManRefineByConstrSim(Ssw_Man_t *p)

{
  ulong *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *pAVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  char *format;
  uint uVar13;
  Ssw_Man_t *p_00;
  ulong uVar14;
  ulong uVar15;
  
  pAVar6 = p->pAig;
  iVar5 = p->vInits->nSize;
  uVar4 = iVar5 / pAVar6->nTruePis;
  if (iVar5 % pAVar6->nTruePis != 0) {
    __assert_fail("Vec_IntSize(p->vInits) % Saig_ManPiNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0xfc,"void Ssw_ManRefineByConstrSim(Ssw_Man_t *)");
  }
  if (0 < pAVar6->nRegs) {
    iVar5 = 0;
    do {
      uVar9 = pAVar6->nTruePos + iVar5;
      if (((int)uVar9 < 0) || (pAVar6->vCos->nSize <= (int)uVar9)) {
LAB_005e62f9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((long)pAVar6->vCos->pArray[uVar9] + 0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffdf;
      iVar5 = iVar5 + 1;
      pAVar6 = p->pAig;
    } while (iVar5 < pAVar6->nRegs);
  }
  if ((int)uVar4 < 1) {
    iVar5 = 0;
  }
  else {
    uVar14 = 0;
    uVar12 = 0;
    p_00 = p;
    do {
      puVar2 = &p->pAig->pConst1->field_0x18;
      *(ulong *)puVar2 = *(ulong *)puVar2 | 0x20;
      pAVar6 = p->pAig;
      if (0 < pAVar6->nTruePis) {
        iVar5 = (int)uVar12;
        lVar10 = 0;
        do {
          if (pAVar6->vCis->nSize <= lVar10) goto LAB_005e62f9;
          if ((iVar5 < 0) || (p->vInits->nSize <= iVar5 + (int)lVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pvVar3 = pAVar6->vCis->pArray[lVar10];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((p->vInits->pArray[uVar12 + lVar10] & 1U) << 5);
          lVar10 = lVar10 + 1;
          pAVar6 = p->pAig;
          p_00 = (Ssw_Man_t *)(long)pAVar6->nTruePis;
        } while (lVar10 < (long)p_00);
        uVar12 = (ulong)(uint)(iVar5 + (int)lVar10);
      }
      iVar5 = (int)uVar12;
      if (0 < pAVar6->nRegs) {
        iVar7 = 0;
        do {
          uVar9 = pAVar6->nTruePos + iVar7;
          if (((int)uVar9 < 0) || (pAVar6->vCos->nSize <= (int)uVar9)) goto LAB_005e62f9;
          uVar13 = pAVar6->nTruePis + iVar7;
          p_00 = (Ssw_Man_t *)(ulong)uVar13;
          if (((int)uVar13 < 0) || (pAVar6->vCis->nSize <= (int)uVar13)) goto LAB_005e62f9;
          pvVar3 = pAVar6->vCis->pArray[uVar13];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAVar6->vCos->pArray[uVar9] + 0x18) & 0x20);
          iVar7 = iVar7 + 1;
          pAVar6 = p->pAig;
        } while (iVar7 < pAVar6->nRegs);
      }
      pVVar11 = pAVar6->vObjs;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          pvVar3 = pVVar11->pArray[lVar10];
          if (pvVar3 != (void *)0x0) {
            uVar9 = ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7;
            p_00 = (Ssw_Man_t *)(ulong)uVar9;
            if (0xfffffffd < uVar9) {
              p_00 = (Ssw_Man_t *)
                     (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                              *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) +
                                       0x18) >> 5) &
                              ((uint)*(ulong *)((long)pvVar3 + 8) ^
                              *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)
                              >> 5) & 1) << 5);
              *(ulong *)((long)pvVar3 + 0x18) =
                   *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf | (ulong)p_00;
              pAVar6 = p->pAig;
            }
          }
          lVar10 = lVar10 + 1;
          pVVar11 = pAVar6->vObjs;
        } while (lVar10 < pVVar11->nSize);
      }
      pVVar11 = pAVar6->vCos;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          pvVar3 = pVVar11->pArray[lVar10];
          p_00 = (Ssw_Man_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe);
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^ *(uint *)&p_00->pFrames) & 0x20);
          lVar10 = lVar10 + 1;
          pAVar6 = p->pAig;
          pVVar11 = pAVar6->vCos;
        } while (lVar10 < pVVar11->nSize);
      }
      uVar8 = (ulong)(uint)pAVar6->nTruePos;
      if (0 < pAVar6->nTruePos) {
        uVar15 = 0;
        do {
          if ((long)pAVar6->vCos->nSize <= (long)uVar15) goto LAB_005e62f9;
          if ((pAVar6->nConstrs != 0) &&
             ((*(ulong *)((long)pAVar6->vCos->pArray[uVar15] + 0x18) & 0x20) != 0)) {
            format = "constraint %d failed in frame %d.\n";
            if ((long)uVar15 < (long)((int)uVar8 - pAVar6->nConstrs)) {
              format = "output %d failed in frame %d.\n";
            }
            Abc_Print((int)p_00,format,uVar15 & 0xffffffff,uVar14);
          }
          uVar15 = uVar15 + 1;
          pAVar6 = p->pAig;
          uVar8 = (ulong)pAVar6->nTruePos;
        } while ((long)uVar15 < (long)uVar8);
      }
      if ((int)uVar14 == 0) {
        pVVar11 = pAVar6->vObjs;
        if (0 < pVVar11->nSize) {
          lVar10 = 0;
          do {
            pvVar3 = pVVar11->pArray[lVar10];
            if (pvVar3 != (void *)0x0) {
              *(ulong *)((long)pvVar3 + 0x18) =
                   *(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7 |
                   (ulong)((uint)(*(ulong *)((long)pvVar3 + 0x18) >> 2) & 8);
              pAVar6 = p->pAig;
            }
            lVar10 = lVar10 + 1;
            pVVar11 = pAVar6->vObjs;
          } while (lVar10 < pVVar11->nSize);
        }
      }
      else {
        Ssw_ClassesRefineConst1(p->ppClasses,0);
        p_00 = (Ssw_Man_t *)p->ppClasses;
        Ssw_ClassesRefine((Ssw_Cla_t *)p_00,0);
      }
      uVar9 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar9;
    } while (uVar9 != uVar4);
  }
  if (iVar5 != p->vInits->nSize) {
    __assert_fail("iLits == Vec_IntSize(p->vInits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,299,"void Ssw_ManRefineByConstrSim(Ssw_Man_t *)");
  }
  return;
}

Assistant:

void Ssw_ManRefineByConstrSim( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, iLits, RetValue1, RetValue2;
    int nFrames = Vec_IntSize(p->vInits) / Saig_ManPiNum(p->pAig);
    assert( Vec_IntSize(p->vInits) % Saig_ManPiNum(p->pAig) == 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = 0;
    // simulate the timeframes
    iLits = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Vec_IntEntry( p->vInits, iLits++ );
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
        // check the outputs
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
            {
                if ( pObj->fMarkB && Saig_ManConstrNum(p->pAig) )
                    Abc_Print( 1, "output %d failed in frame %d.\n", i, f );
            }
            else
            {
                if ( pObj->fMarkB && Saig_ManConstrNum(p->pAig) )
                    Abc_Print( 1, "constraint %d failed in frame %d.\n", i, f );
            }
        }
        // transfer
        if ( f == 0 )
        { // copy markB into phase
            Aig_ManForEachObj( p->pAig, pObj, i )
                pObj->fPhase = pObj->fMarkB;
        }
        else
        { // refine classes
            RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
            RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        }
    }
    assert( iLits == Vec_IntSize(p->vInits) );
}